

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O3

char * i2s_ASN1_INTEGER(X509V3_EXT_METHOD *meth,ASN1_INTEGER *aint)

{
  BIGNUM *a;
  char *pcVar1;
  
  pcVar1 = (char *)0x0;
  if (aint != (ASN1_INTEGER *)0x0) {
    a = ASN1_INTEGER_to_BN(aint,(BIGNUM *)0x0);
    if (a != (BIGNUM *)0x0) {
      pcVar1 = bignum_to_string((BIGNUM *)a);
    }
    BN_free(a);
  }
  return pcVar1;
}

Assistant:

char *i2s_ASN1_INTEGER(const X509V3_EXT_METHOD *method, const ASN1_INTEGER *a) {
  BIGNUM *bntmp = NULL;
  char *strtmp = NULL;
  if (!a) {
    return NULL;
  }
  if (!(bntmp = ASN1_INTEGER_to_BN(a, NULL)) ||
      !(strtmp = bignum_to_string(bntmp))) {
  }
  BN_free(bntmp);
  return strtmp;
}